

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

void mac_block_mesh(ossl_gost_imit_ctx *c,uchar *data)

{
  if ((c->key_meshing != 0) && (c->count == 0x400)) {
    cryptopro_key_meshing(&c->cctx,(uchar *)0x0);
  }
  mac_block(&c->cctx,c->buffer,data);
  c->count = (c->count & 0x3ff) + 8;
  return;
}

Assistant:

static void mac_block_mesh(struct ossl_gost_imit_ctx *c,
                           const unsigned char *data)
{
    /*
     * We are using NULL for iv because CryptoPro doesn't interpret
     * internal state of MAC algorithm as iv during keymeshing (but does
     * initialize internal state from iv in key transport
     */
    assert(c->count % 8 == 0 && c->count <= 1024);
    if (c->key_meshing && c->count == 1024) {
        cryptopro_key_meshing(&(c->cctx), NULL);
    }
    mac_block(&(c->cctx), c->buffer, data);
    c->count = c->count % 1024 + 8;
}